

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O2

ArenaAllocator * __thiscall
DListBase<Memory::ArenaAllocator,RealCount>::
PrependNode<Memory::HeapAllocator,char16_t_const*,Memory::PageAllocatorBase<Memory::VirtualAllocWrapper,Memory::SegmentBase<Memory::VirtualAllocWrapper>,Memory::PageSegmentBase<Memory::VirtualAllocWrapper>>*,void(*)()>
          (DListBase<Memory::ArenaAllocator,RealCount> *this,HeapAllocator *allocator,
          char16_t *param1,
          PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
          *param2,_func_void *param3)

{
  DListNodeBase<Memory::ArenaAllocator> *pDVar1;
  HeapAllocator *alloc;
  DListNode<Memory::ArenaAllocator> *this_00;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  local_60 = (undefined1  [8])&DListNode<Memory::ArenaAllocator>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_26dcec;
  data.filename._0_4_ = 0x131;
  data._32_8_ = param3;
  alloc = Memory::HeapAllocator::TrackAllocInfo(allocator,(TrackAllocData *)local_60);
  this_00 = (DListNode<Memory::ArenaAllocator> *)new<Memory::HeapAllocator>(0x90,alloc,0x2f6726);
  DListNode<Memory::ArenaAllocator>::
  DListNode<char16_t_const*,Memory::PageAllocatorBase<Memory::VirtualAllocWrapper,Memory::SegmentBase<Memory::VirtualAllocWrapper>,Memory::PageSegmentBase<Memory::VirtualAllocWrapper>>*,void(*)()>
            (this_00,param1,param2,(_func_void *)data._32_8_);
  pDVar1 = *(DListNodeBase<Memory::ArenaAllocator> **)this;
  (this_00->super_DListNodeBase<Memory::ArenaAllocator>).prev = pDVar1->prev;
  (this_00->super_DListNodeBase<Memory::ArenaAllocator>).next.base = pDVar1;
  *(DListNode<Memory::ArenaAllocator> **)pDVar1->prev = this_00;
  (pDVar1->prev).node = this_00;
  *(int *)(this + 0x10) = *(int *)(this + 0x10) + 1;
  return &this_00->data;
}

Assistant:

TData * PrependNode(TAllocator * allocator, TParam1 param1, TParam2 param2, TParam3 param3)
    {
        Node * newNode = AllocatorNew(TAllocator, allocator, Node, param1, param2, param3);
        if (newNode)
        {
            DListBase::InsertNodeBefore(this->Next(), newNode);
            this->IncrementCount();
            return &newNode->data;
        }
        return nullptr;
    }